

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O2

int IncreasePreviousDuration(WebPAnimEncoder *enc,int duration)

{
  EncodedFrame *pEVar1;
  size_t __n;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  WebPData *pWVar7;
  WebPData lossless_1x1;
  WebPData lossy_1x1;
  uint8_t lossless_1x1_bytes [28];
  uint8_t lossy_1x1_bytes [72];
  
  pWVar7 = &lossless_1x1;
  pEVar1 = enc->encoded_frames_ + enc->start_ + enc->count_;
  iVar4 = enc->encoded_frames_[enc->start_ + (enc->count_ - 1)].sub_frame_.duration + duration;
  if (iVar4 < 0x1000000) {
    pEVar1[-1].sub_frame_.duration = iVar4;
    pEVar1[-1].key_frame_.duration = iVar4;
  }
  else {
    lossless_1x1_bytes[0x10] = '\b';
    lossless_1x1_bytes[0x11] = '\0';
    lossless_1x1_bytes[0x12] = '\0';
    lossless_1x1_bytes[0x13] = '\0';
    lossless_1x1_bytes[0x14] = '/';
    lossless_1x1_bytes[0x15] = '\0';
    lossless_1x1_bytes[0x16] = '\0';
    lossless_1x1_bytes[0x17] = '\0';
    lossless_1x1_bytes[0x18] = '\x10';
    lossless_1x1_bytes[0x19] = 0x88;
    lossless_1x1_bytes[0x1a] = 0x88;
    lossless_1x1_bytes[0x1b] = '\b';
    builtin_memcpy(lossless_1x1_bytes,"RIFF\x14",6);
    lossless_1x1_bytes[6] = '\0';
    lossless_1x1_bytes[7] = '\0';
    lossless_1x1_bytes[8] = 'W';
    lossless_1x1_bytes[9] = 'E';
    lossless_1x1_bytes[10] = 'B';
    lossless_1x1_bytes[0xb] = 'P';
    lossless_1x1_bytes[0xc] = 'V';
    lossless_1x1_bytes[0xd] = 'P';
    lossless_1x1_bytes[0xe] = '8';
    lossless_1x1_bytes[0xf] = 'L';
    lossless_1x1.bytes = lossless_1x1_bytes;
    lossless_1x1.size = 0x1c;
    pcVar6 = "RIFF@";
    puVar3 = lossy_1x1_bytes;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)puVar3 = *(undefined8 *)pcVar6;
      pcVar6 = pcVar6 + 8;
      puVar3 = puVar3 + 8;
    }
    lossy_1x1.bytes = lossy_1x1_bytes;
    lossy_1x1.size = 0x48;
    if (((enc->last_config_).lossless == 0) &&
       (pWVar7 = &lossless_1x1, (enc->options_).allow_mixed == 0)) {
      pWVar7 = &lossy_1x1;
    }
    pEVar1->is_key_frame_ = 0;
    (pEVar1->sub_frame_).id = WEBP_CHUNK_ANMF;
    (pEVar1->sub_frame_).x_offset = 0;
    (pEVar1->sub_frame_).y_offset = 0;
    (pEVar1->sub_frame_).dispose_method = WEBP_MUX_DISPOSE_NONE;
    (pEVar1->sub_frame_).blend_method = WEBP_MUX_BLEND;
    (pEVar1->sub_frame_).duration = duration;
    if (pEVar1 == (EncodedFrame *)0x0) {
      return 0;
    }
    (pEVar1->sub_frame_).bitstream.bytes = (uint8_t *)0x0;
    (pEVar1->sub_frame_).bitstream.size = 0;
    if ((pWVar7->bytes != (uint8_t *)0x0) && (pWVar7->size != 0)) {
      puVar3 = (uint8_t *)WebPMalloc(pWVar7->size);
      (pEVar1->sub_frame_).bitstream.bytes = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        return 0;
      }
      __n = pWVar7->size;
      memcpy(puVar3,pWVar7->bytes,__n);
      (pEVar1->sub_frame_).bitstream.size = __n;
    }
    sVar2 = enc->count_;
    enc->count_ = sVar2 + 1;
    enc->count_since_key_frame_ = enc->count_since_key_frame_ + 1;
    enc->flush_count_ = sVar2;
    enc->prev_candidate_undecided_ = 0;
    (enc->prev_rect_).x_offset_ = 0;
    (enc->prev_rect_).y_offset_ = 0;
    (enc->prev_rect_).width_ = 1;
    (enc->prev_rect_).height_ = 1;
  }
  return 1;
}

Assistant:

static int IncreasePreviousDuration(WebPAnimEncoder* const enc, int duration) {
  const size_t position = enc->count_ - 1;
  EncodedFrame* const prev_enc_frame = GetFrame(enc, position);
  int new_duration;

  assert(enc->count_ >= 1);
  assert(!prev_enc_frame->is_key_frame_ ||
         prev_enc_frame->sub_frame_.duration ==
         prev_enc_frame->key_frame_.duration);
  assert(prev_enc_frame->sub_frame_.duration ==
         (prev_enc_frame->sub_frame_.duration & (MAX_DURATION - 1)));
  assert(duration == (duration & (MAX_DURATION - 1)));

  new_duration = prev_enc_frame->sub_frame_.duration + duration;
  if (new_duration >= MAX_DURATION) {  // Special case.
    // Separate out previous frame from earlier merged frames to avoid overflow.
    // We add a 1x1 transparent frame for the previous frame, with blending on.
    const FrameRectangle rect = { 0, 0, 1, 1 };
    const uint8_t lossless_1x1_bytes[] = {
      0x52, 0x49, 0x46, 0x46, 0x14, 0x00, 0x00, 0x00, 0x57, 0x45, 0x42, 0x50,
      0x56, 0x50, 0x38, 0x4c, 0x08, 0x00, 0x00, 0x00, 0x2f, 0x00, 0x00, 0x00,
      0x10, 0x88, 0x88, 0x08
    };
    const WebPData lossless_1x1 = {
      lossless_1x1_bytes, sizeof(lossless_1x1_bytes)
    };
    const uint8_t lossy_1x1_bytes[] = {
      0x52, 0x49, 0x46, 0x46, 0x40, 0x00, 0x00, 0x00, 0x57, 0x45, 0x42, 0x50,
      0x56, 0x50, 0x38, 0x58, 0x0a, 0x00, 0x00, 0x00, 0x10, 0x00, 0x00, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x41, 0x4c, 0x50, 0x48, 0x02, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x56, 0x50, 0x38, 0x20, 0x18, 0x00, 0x00, 0x00,
      0x30, 0x01, 0x00, 0x9d, 0x01, 0x2a, 0x01, 0x00, 0x01, 0x00, 0x02, 0x00,
      0x34, 0x25, 0xa4, 0x00, 0x03, 0x70, 0x00, 0xfe, 0xfb, 0xfd, 0x50, 0x00
    };
    const WebPData lossy_1x1 = { lossy_1x1_bytes, sizeof(lossy_1x1_bytes) };
    const int can_use_lossless =
        (enc->last_config_.lossless || enc->options_.allow_mixed);
    EncodedFrame* const curr_enc_frame = GetFrame(enc, enc->count_);
    curr_enc_frame->is_key_frame_ = 0;
    curr_enc_frame->sub_frame_.id = WEBP_CHUNK_ANMF;
    curr_enc_frame->sub_frame_.x_offset = 0;
    curr_enc_frame->sub_frame_.y_offset = 0;
    curr_enc_frame->sub_frame_.dispose_method = WEBP_MUX_DISPOSE_NONE;
    curr_enc_frame->sub_frame_.blend_method = WEBP_MUX_BLEND;
    curr_enc_frame->sub_frame_.duration = duration;
    if (!WebPDataCopy(can_use_lossless ? &lossless_1x1 : &lossy_1x1,
                      &curr_enc_frame->sub_frame_.bitstream)) {
      return 0;
    }
    ++enc->count_;
    ++enc->count_since_key_frame_;
    enc->flush_count_ = enc->count_ - 1;
    enc->prev_candidate_undecided_ = 0;
    enc->prev_rect_ = rect;
  } else {                           // Regular case.
    // Increase duration of the previous frame by 'duration'.
    prev_enc_frame->sub_frame_.duration = new_duration;
    prev_enc_frame->key_frame_.duration = new_duration;
  }
  return 1;
}